

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O0

void __thiscall CompilerStatistics::Add(CompilerStatistics *this,CompilerStatistics *other)

{
  uint uVar1;
  Timer *pTVar2;
  uint local_1c;
  uint i;
  CompilerStatistics *other_local;
  CompilerStatistics *this_local;
  
  local_1c = 0;
  while( true ) {
    uVar1 = SmallArray<CompilerStatistics::Timer,_16U>::size(&this->timers);
    if (uVar1 <= local_1c) break;
    pTVar2 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&other->timers,local_1c);
    uVar1 = pTVar2->total;
    pTVar2 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&this->timers,local_1c);
    pTVar2->total = uVar1 + pTVar2->total;
    local_1c = local_1c + 1;
  }
  this->finishTime = 0;
  return;
}

Assistant:

void Add(CompilerStatistics& other)
	{
		for(unsigned i = 0; i < timers.size(); i++)
			timers[i].total += other.timers[i].total;

		finishTime = 0;
	}